

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::GrowNoAnnotate
          (RepeatedField<double> *this,bool was_soo,int old_size,int new_size)

{
  uint uVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 this_00;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  long lVar3;
  double *__src;
  string *psVar4;
  undefined8 uVar5;
  undefined7 in_register_00000031;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  LogMessageFatal local_40 [16];
  
  iVar6 = 1;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar6 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar6 < new_size) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      this_00.arena = internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      paVar2 = &heap_rep(this)->field_0;
      this_00 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar2->arena;
    }
    if (new_size < 1) {
      uVar7 = 1;
    }
    else if (iVar6 < 0x3ffffffc) {
      if (iVar6 < 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                   ,0x488,0x28,"capacity == 0 || capacity >= lower_limit");
        uVar5 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                          (local_40);
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (uVar5,1," ");
        _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                  (uVar5);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      }
      uVar1 = iVar6 * 2 + 1;
      if ((uint)new_size < uVar1) {
        new_size = uVar1;
      }
      uVar7 = (ulong)(uint)new_size;
    }
    else {
      uVar7 = 0x7fffffff;
    }
    if (this_00.arena == (Arena *)0x0) {
      uVar8 = uVar7 * 8 + 8;
      lVar3 = __tls_get_addr(&PTR_001b3e58);
      if (*(code **)(lVar3 + 0x20) == (code *)0x0) {
        paVar2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)operator_new(uVar8);
      }
      else {
        auVar9 = (**(code **)(lVar3 + 0x20))(uVar8,*(undefined8 *)(lVar3 + 0x28));
        paVar2 = auVar9._0_8_;
        uVar7 = auVar9._8_8_ - 8U >> 3;
      }
      uVar8 = 0x7fffffff;
      if (uVar7 < 0x7fffffff) {
        uVar8 = uVar7;
      }
    }
    else {
      paVar2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)
               Arena::AllocateForArray(this_00.arena,uVar7 * 8 + 0xf & 0x7fffffff8);
      uVar8 = uVar7;
    }
    paVar2->arena = (Arena *)this_00;
    if (0 < old_size) {
      __src = elements(this,was_soo);
      memcpy(paVar2 + 1,__src,(ulong)(uint)old_size << 3);
    }
    if (!was_soo) {
      InternalDeallocate<false>(this);
    }
    internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,(int)uVar8,paVar2 + 1);
    return;
  }
  psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     ((long)new_size,(long)iVar6,"new_size > old_capacity");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x4a2,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}